

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O0

bool __thiscall r_exec::HLPOverlay::evaluate_fwd_guards(HLPOverlay *this)

{
  bool bVar1;
  HLPOverlay *this_local;
  
  bVar1 = evaluate_guards(this,3);
  return bVar1;
}

Assistant:

bool HLPOverlay::evaluate_fwd_guards()
{
    return evaluate_guards(HLP_FWD_GUARDS);
}